

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

int big_array_init(BigArray *array,void *buf,char *dtype,int ndim,size_t *dims,ptrdiff_t *strides)

{
  size_t sVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  char ndtype [8];
  char acStack_38 [2];
  char local_36 [6];
  
  memset(array,0,0x220);
  _dtype_normalize(array->dtype,dtype);
  array->data = buf;
  array->ndim = ndim;
  memset(array->dims,0,0x200);
  array->size = 1;
  if (ndim < 1) {
    if (strides != (ptrdiff_t *)0x0) {
      return 0;
    }
  }
  else {
    uVar4 = 0;
    do {
      sVar1 = dims[uVar4];
      array->dims[uVar4] = sVar1;
      array->size = sVar1 * array->size;
      uVar4 = uVar4 + 1;
    } while ((uint)ndim != uVar4);
    if (strides != (ptrdiff_t *)0x0) {
      if (ndim < 1) {
        return 0;
      }
      uVar4 = 0;
      do {
        array->strides[uVar4] = strides[uVar4];
        uVar4 = uVar4 + 1;
      } while ((uint)ndim != uVar4);
      return 0;
    }
  }
  _dtype_normalize(acStack_38,dtype);
  iVar2 = atoi(local_36);
  array->strides[(long)ndim + -1] = (long)iVar2;
  if (1 < ndim) {
    uVar4 = (ulong)(ndim - 2);
    lVar3 = array->strides[uVar4 + 1];
    do {
      lVar3 = lVar3 * array->dims[uVar4 + 1];
      array->strides[uVar4] = lVar3;
      bVar5 = uVar4 != 0;
      uVar4 = uVar4 - 1;
    } while (bVar5);
  }
  return 0;
}

Assistant:

int
big_array_init(BigArray * array, void * buf, const char * dtype, int ndim, const size_t dims[], const ptrdiff_t strides[])
{

    memset(array, 0, sizeof(array[0]));

    _dtype_normalize(array->dtype, dtype);
    array->data = buf;
    array->ndim = ndim;
    int i;
    memset(array->dims, 0, sizeof(ptrdiff_t) * 32);
    memset(array->strides, 0, sizeof(ptrdiff_t) * 32);
    array->size = 1;
    for(i = 0; i < ndim; i ++) {
        array->dims[i] = dims[i];
        array->size *= dims[i];
    }
    if(strides != NULL) {
        for(i = 0; i < ndim; i ++) {
            array->strides[i] = strides[i];
        }
    } else {
        array->strides[ndim - 1] = big_file_dtype_itemsize(dtype);
        for(i = ndim - 2; i >= 0; i --) {
            array->strides[i] = array->strides[i + 1] * array->dims[i + 1];
        }
    }
    return 0;
}